

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

back_insert_iterator<fmt::v10::detail::buffer<char>_>
fmt::v10::detail::
copy_str<char,char_const*,std::back_insert_iterator<fmt::v10::detail::buffer<char>>>
          (char *begin,char *end,back_insert_iterator<fmt::v10::detail::buffer<char>_> out)

{
  back_insert_iterator<fmt::v10::detail::buffer<char>_> *this;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_38;
  char local_29;
  char *local_28;
  char *end_local;
  char *begin_local;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> out_local;
  
  local_28 = end;
  end_local = begin;
  begin_local = (char *)out.container;
  while (end_local != local_28) {
    local_29 = *end_local;
    end_local = end_local + 1;
    local_38 = std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator++
                         ((back_insert_iterator<fmt::v10::detail::buffer<char>_> *)&begin_local,0);
    this = std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*(&local_38);
    std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=(this,&local_29);
  }
  return (back_insert_iterator<fmt::v10::detail::buffer<char>_>)(buffer<char> *)begin_local;
}

Assistant:

FMT_CONSTEXPR auto copy_str(InputIt begin, InputIt end, OutputIt out)
    -> OutputIt {
  while (begin != end) *out++ = static_cast<Char>(*begin++);
  return out;
}